

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleLeggedOdometry.cpp
# Opt level: O0

bool __thiscall
iDynTree::SimpleLeggedOdometry::changeFixedFrame
          (SimpleLeggedOdometry *this,string *newFixedFrame,Transform *world_H_newFixedFrame)

{
  long lVar1;
  string *in_RDI;
  FrameIndex newFixedFrameIndex;
  Transform *in_stack_000000f8;
  FrameIndex in_stack_00000100;
  SimpleLeggedOdometry *in_stack_00000108;
  bool local_1;
  
  lVar1 = iDynTree::Model::getFrameIndex(in_RDI);
  if (lVar1 == FRAME_INVALID_INDEX) {
    iDynTree::reportError
              ("SimpleLeggedOdometry","changeFixedFrame",
               "changeFixedFrame was called, but the provided new fixed frame is unknown.");
    local_1 = false;
  }
  else {
    local_1 = changeFixedFrame(in_stack_00000108,in_stack_00000100,in_stack_000000f8);
  }
  return local_1;
}

Assistant:

bool SimpleLeggedOdometry::changeFixedFrame(const std::string& newFixedFrame, const Transform & world_H_newFixedFrame)
{
    iDynTree::FrameIndex newFixedFrameIndex = this->m_model.getFrameIndex(newFixedFrame);

    if( newFixedFrameIndex == FRAME_INVALID_INDEX )
    {
        reportError("SimpleLeggedOdometry",
                    "changeFixedFrame",
                    "changeFixedFrame was called, but the provided new fixed frame is unknown.");
        return false;
    }

    return this->changeFixedFrame(newFixedFrameIndex, world_H_newFixedFrame);
}